

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmemory.h
# Opt level: O0

void zng_memwrite_4(void *ptr,uint32_t val)

{
  uint32_t val_local;
  void *ptr_local;
  
  *(uint32_t *)ptr = val;
  return;
}

Assistant:

static inline void zng_memwrite_4(void *ptr, uint32_t val) {
#if defined(HAVE_MAY_ALIAS)
    typedef struct { uint32_t val; } __attribute__ ((__packed__, __may_alias__)) unaligned_uint32_t;
    ((unaligned_uint32_t *)ptr)->val = val;
#else
    memcpy(ptr, &val, sizeof(val));
#endif
}